

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O1

complex<double> __thiscall dlib::rand::get_random_complex_gaussian(rand *this)

{
  int iVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  double __x;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM4 [16];
  complex<double> cVar11;
  
  do {
    iVar1 = (this->mt).i;
    iVar4 = 0;
    if ((iVar1 == 0x270) || (iVar4 = 1, 0x4df < iVar1)) {
      random_helpers::
      mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
      ::twist(&this->mt,iVar4);
    }
    iVar1 = (this->mt).i;
    uVar5 = (this->mt).x[iVar1];
    (this->mt).i = iVar1 + 1;
    uVar5 = uVar5 >> 0xb ^ uVar5;
    uVar5 = (uVar5 & 0x13a58ad) << 7 ^ uVar5;
    uVar5 = (uVar5 & 0x1df8c) << 0xf ^ uVar5;
    auVar8 = vcvtusi2sd_avx512f(in_XMM4,uVar5 >> 0x12 ^ uVar5);
    auVar9._0_8_ = auVar8._0_8_ / 4294967295.0;
    auVar9._8_8_ = auVar8._8_8_;
    iVar4 = 0;
    if ((iVar1 + 1 == 0x270) || (iVar4 = 1, 0x4de < iVar1)) {
      random_helpers::
      mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
      ::twist(&this->mt,iVar4);
      auVar9._8_8_ = 0;
    }
    iVar1 = (this->mt).i;
    uVar5 = (this->mt).x[iVar1];
    (this->mt).i = iVar1 + 1;
    uVar5 = uVar5 >> 0xb ^ uVar5;
    uVar5 = (uVar5 & 0x13a58ad) << 7 ^ uVar5;
    uVar5 = (uVar5 & 0x1df8c) << 0xf ^ uVar5;
    auVar8 = vcvtusi2sd_avx512f(in_XMM4,uVar5 >> 0x12 ^ uVar5);
    auVar10._0_8_ = auVar8._0_8_ / 4294967295.0;
    auVar10._8_8_ = auVar8._8_8_;
    auVar8 = vfmadd213sd_fma(auVar9,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar9 = vfmadd213sd_fma(auVar10,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar9._0_8_ * auVar9._0_8_;
    auVar8 = vfmadd231sd_fma(auVar7,auVar8,auVar8);
    __x = auVar8._0_8_;
  } while (1.0 <= __x);
  dVar6 = log(__x);
  auVar8._0_8_ = (dVar6 * -2.0) / __x;
  auVar8._8_8_ = 0;
  if (auVar8._0_8_ < 0.0) {
    sqrt(auVar8._0_8_);
    uVar2 = extraout_RAX_00;
    uVar3 = extraout_RDX_00;
  }
  else {
    vsqrtsd_avx(auVar8,auVar8);
    uVar2 = extraout_RAX;
    uVar3 = extraout_RDX;
  }
  cVar11._M_value._8_8_ = uVar3;
  cVar11._M_value._0_8_ = uVar2;
  return (complex<double>)cVar11._M_value;
}

Assistant:

std::complex<double> get_random_complex_gaussian (
            )
            {
                double x1, x2, w;

                const double rndmax = std::numeric_limits<dlib::uint32>::max();

                // Generate a pair of Gaussian random numbers using the Box-Muller transformation.
                do 
                {
                    const double rnd1 = get_random_32bit_number()/rndmax;
                    const double rnd2 = get_random_32bit_number()/rndmax;

                    x1 = 2.0 * rnd1 - 1.0;
                    x2 = 2.0 * rnd2 - 1.0;
                    w = x1 * x1 + x2 * x2;
                } while ( w >= 1.0 );

                w = std::sqrt( (-2.0 * std::log( w ) ) / w );
                return std::complex<double>(x1 * w, x2 * w);
            }